

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrUniqify(Vec_Ptr_t *p,_func_int_varargs *Vec_PtrSortCompare)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  _func_int_varargs *Vec_PtrSortCompare_local;
  Vec_Ptr_t *p_local;
  
  if (1 < p->nSize) {
    Vec_PtrSort(p,Vec_PtrSortCompare);
    local_20 = 1;
    for (local_1c = 1; local_1c < p->nSize; local_1c = local_1c + 1) {
      if (p->pArray[local_1c] != p->pArray[local_1c + -1]) {
        p->pArray[local_20] = p->pArray[local_1c];
        local_20 = local_20 + 1;
      }
    }
    p->nSize = local_20;
  }
  return;
}

Assistant:

static void Vec_PtrUniqify( Vec_Ptr_t * p, int (*Vec_PtrSortCompare)() )
{
    int i, k;
    if ( p->nSize < 2 )
        return;
    Vec_PtrSort( p, Vec_PtrSortCompare );
    for ( i = k = 1; i < p->nSize; i++ )
        if ( p->pArray[i] != p->pArray[i-1] )
            p->pArray[k++] = p->pArray[i];
    p->nSize = k;
}